

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O3

void __thiscall QColor::setRgb(QColor *this,QRgb rgb)

{
  ushort uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  
  this->cspec = Rgb;
  (this->ct).argb.alpha = 0xffff;
  (this->ct).argb.red = (ushort)((rgb >> 0x10) << 8) | (ushort)((rgb & 0xff00ff) >> 0x10);
  uVar2 = rgb >> 8 & 0xff;
  uVar1 = (ushort)(rgb & 0xff00ff);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)uVar2 | (ulong)uVar1 << 0x10;
  auVar3 = psllw(auVar3,8);
  *(uint *)((long)&this->ct + 4) = CONCAT22(auVar3._2_2_ + uVar1,auVar3._0_2_ + (short)uVar2);
  (this->ct).argb.pad = 0;
  return;
}

Assistant:

void QColor::setRgb(QRgb rgb) noexcept
{
    cspec = Rgb;
    ct.argb.alpha = 0xffff;
    ct.argb.red   = qRed(rgb)   * 0x101;
    ct.argb.green = qGreen(rgb) * 0x101;
    ct.argb.blue  = qBlue(rgb)  * 0x101;
    ct.argb.pad   = 0;
}